

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsHeader.cpp
# Opt level: O3

void __thiscall KDReports::Header::Header(Header *this,Report *report)

{
  _Head_base<0UL,_KDReports::HeaderPrivate_*,_false> this_00;
  QTextDocument *pQVar1;
  pointer *__ptr;
  QFont aQStack_28 [16];
  
  this_00._M_head_impl = (HeaderPrivate *)operator_new(0xd8);
  HeaderPrivate::HeaderPrivate(this_00._M_head_impl,report);
  (this->d)._M_t.
  super___uniq_ptr_impl<KDReports::HeaderPrivate,_std::default_delete<KDReports::HeaderPrivate>_>.
  _M_t.
  super__Tuple_impl<0UL,_KDReports::HeaderPrivate_*,_std::default_delete<KDReports::HeaderPrivate>_>
  .super__Head_base<0UL,_KDReports::HeaderPrivate_*,_false>._M_head_impl = this_00._M_head_impl;
  pQVar1 = TextDocument::contentDocument((TextDocument *)this_00._M_head_impl);
  (*((report->d)._M_t.
     super___uniq_ptr_impl<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_>
     ._M_t.
     super__Tuple_impl<0UL,_KDReports::ReportPrivate_*,_std::default_delete<KDReports::ReportPrivate>_>
     .super__Head_base<0UL,_KDReports::ReportPrivate_*,_false>._M_head_impl)->m_layout->
    _vptr_AbstractReportLayout[4])(aQStack_28);
  QTextDocument::setDefaultFont((QFont *)pQVar1);
  QFont::~QFont(aQStack_28);
  return;
}

Assistant:

KDReports::Header::Header(KDReports::Report *report)
    : d(new HeaderPrivate(report))
{
    d->m_textDocument.contentDocument().setDefaultFont(report->d->m_layout->defaultFont());
}